

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O2

int Ssw_ManSweep(Ssw_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  abctime aVar2;
  Aig_Man_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  abctime aVar7;
  Vec_Int_t *vPairs;
  int *piVar8;
  Aig_Obj_t *p1;
  Ssw_Pars_t *pSVar9;
  char *pString;
  uint uVar10;
  int iVar11;
  int iVar12;
  Bar_Progress_t *local_40;
  
  aVar2 = Abc_Clock();
  pAVar3 = Ssw_FramesWithClasses(p);
  p->pFrames = pAVar3;
  uVar10 = pAVar3->nObjs[3] - p->pAig->nRegs;
  if ((uVar10 & 1) != 0) {
    __assert_fail("(nConstrPairs & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSweep.c"
                  ,0x184,"int Ssw_ManSweep(Ssw_Man_t *)");
  }
  for (iVar11 = 0; iVar11 < (int)uVar10; iVar11 = iVar11 + 2) {
    pAVar4 = Aig_ManCo(p->pFrames,iVar11);
    pAVar5 = Aig_ManCo(p->pFrames,iVar11 + 1);
    Ssw_NodesAreConstrained(p,pAVar4->pFanin0,pAVar5->pFanin0);
  }
  for (iVar11 = 0; iVar11 < p->pAig->nRegs; iVar11 = iVar11 + 1) {
    pAVar4 = Aig_ManCo(p->pFrames,iVar11 + uVar10);
    Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe));
  }
  sat_solver_simplify(p->pMSat->pSat);
  iVar11 = p->pPars->nFramesK;
  p->pNodeToFrames[p->pAig->pConst1->Id * p->nFrames + iVar11] = p->pFrames->pConst1;
  for (iVar12 = 0; iVar12 < p->pAig->nTruePis; iVar12 = iVar12 + 1) {
    pvVar6 = Vec_PtrEntry(p->pAig->vCis,iVar12);
    pAVar4 = Aig_ObjCreateCi(p->pFrames);
    p->pNodeToFrames[*(int *)((long)pvVar6 + 0x24) * p->nFrames + iVar11] = pAVar4;
  }
  aVar7 = Abc_Clock();
  p->timeReduce = p->timeReduce + (aVar7 - aVar2);
  p->fRefined = 0;
  Ssw_ClassesClearRefined(p->ppClasses);
  pSVar9 = p->pPars;
  if (pSVar9->fVerbose == 0) {
    local_40 = (Bar_Progress_t *)0x0;
  }
  else {
    local_40 = Bar_ProgressStart(_stdout,p->pAig->vObjs->nSize);
    pSVar9 = p->pPars;
  }
  if ((pSVar9->fEquivDump == 0) && (pSVar9->fEquivDump2 == 0)) {
    vPairs = (Vec_Int_t *)0x0;
  }
  else {
    vPairs = (Vec_Int_t *)malloc(0x10);
    vPairs->nCap = 1000;
    vPairs->nSize = 0;
    piVar8 = (int *)malloc(4000);
    vPairs->pArray = piVar8;
  }
  iVar12 = 0;
  do {
    p_00 = p->pAig->vObjs;
    if (p_00->nSize <= iVar12) {
      pSVar9 = p->pPars;
      if (pSVar9->fVerbose != 0) {
        Bar_ProgressStop(local_40);
        pSVar9 = p->pPars;
      }
      iVar11 = Ssw_ManSweep::Counter;
      if (pSVar9->fEquivDump != 0) {
        Ssw_ManSweep::Counter = Ssw_ManSweep::Counter + 1;
        Ssw_ManDumpEquivMiter(p->pAig,vPairs,iVar11,1);
        pSVar9 = p->pPars;
      }
      if ((pSVar9->fEquivDump2 != 0) && (p->fRefined == 0)) {
        Ssw_ManDumpEquivMiter(p->pAig,vPairs,0,0);
      }
      if (vPairs != (Vec_Int_t *)0x0) {
        free(vPairs->pArray);
        free(vPairs);
      }
      return p->fRefined;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar12);
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      if (p->pPars->fVerbose != 0) {
        Bar_ProgressUpdate(local_40,iVar12,pString);
      }
      uVar10 = (uint)*(undefined8 *)&pAVar4->field_0x18;
      if ((uVar10 & 7) == 2) {
        pAVar3 = p->pAig;
        iVar1 = Aig_ObjCioId(pAVar4);
        if (iVar1 < pAVar3->nTruePis) {
          uVar10 = (uint)*(undefined8 *)&pAVar4->field_0x18;
          goto LAB_00570411;
        }
      }
      else {
LAB_00570411:
        if ((uVar10 & 7) - 7 < 0xfffffffe) goto LAB_0057047a;
        pAVar3 = p->pFrames;
        pAVar5 = Ssw_ObjChild0Fra(p,pAVar4,iVar11);
        p1 = Ssw_ObjChild1Fra(p,pAVar4,iVar11);
        pAVar5 = Aig_And(pAVar3,pAVar5,p1);
        p->pNodeToFrames[pAVar4->Id * p->nFrames + iVar11] = pAVar5;
      }
      uVar10 = Ssw_ManSweepNode(p,pAVar4,iVar11,0,vPairs);
      p->fRefined = p->fRefined | uVar10;
    }
LAB_0057047a:
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

int Ssw_ManSweep( Ssw_Man_t * p )
{
    static int Counter;
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObj2, * pObjNew;
    int nConstrPairs, i, f;
    abctime clk;
    Vec_Int_t * vObjPairs;

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    // add constants
    nConstrPairs = Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig);
    assert( (nConstrPairs & 1) == 0 );
    for ( i = 0; i < nConstrPairs; i += 2 )
    {
        pObj  = Aig_ManCo( p->pFrames, i   );
        pObj2 = Aig_ManCo( p->pFrames, i+1 );
        Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj), Aig_ObjChild0(pObj2) );
    }
    // build logic cones for register inputs
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        pObj  = Aig_ManCo( p->pFrames, nConstrPairs + i );
        Ssw_CnfNodeAddToSolver( p->pMSat, Aig_ObjFanin0(pObj) );//
    }
    sat_solver_simplify( p->pMSat->pSat );

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
p->timeReduce += Abc_Clock() - clk;

    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    vObjPairs = (p->pPars->fEquivDump || p->pPars->fEquivDump2)? Vec_IntAlloc(1000) : NULL;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, vObjPairs );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, vObjPairs );
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    if ( p->pPars->fEquivDump )
        Ssw_ManDumpEquivMiter( p->pAig, vObjPairs, Counter++, 1 );
    if ( p->pPars->fEquivDump2 && !p->fRefined )
        Ssw_ManDumpEquivMiter( p->pAig, vObjPairs, 0, 0 );
    Vec_IntFreeP( &vObjPairs );
    return p->fRefined;
}